

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NTSCD.h
# Opt level: O1

ValVec * __thiscall
dg::llvmdg::InterproceduralNTSCD::getDependencies
          (ValVec *__return_storage_ptr__,InterproceduralNTSCD *this,BasicBlock *b)

{
  CDNode *pCVar1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  set<llvm::Value_*,_std::less<llvm::Value_*>,_std::allocator<llvm::Value_*>_> ret;
  Value *local_68;
  _Rb_tree<llvm::Value_*,_llvm::Value_*,_std::_Identity<llvm::Value_*>,_std::less<llvm::Value_*>,_std::allocator<llvm::Value_*>_>
  local_60;
  
  if ((this->super_LLVMControlDependenceAnalysisImpl)._options.
      super_ControlDependenceAnalysisOptions.field_0x3d != '\x01') {
    _compute(this);
    pCVar1 = ICDGraphBuilder::getNode(&this->igraphBuilder,(Value *)b);
    if (pCVar1 != (CDNode *)0x0) {
      p_Var4 = &(this->controlDependence)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (this->controlDependence)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var3 = &p_Var4->_M_header;
      for (; p_Var5 != (_Base_ptr)0x0;
          p_Var5 = (&p_Var5->_M_left)[*(CDNode **)(p_Var5 + 1) < pCVar1]) {
        if (*(CDNode **)(p_Var5 + 1) >= pCVar1) {
          p_Var3 = p_Var5;
        }
      }
      p_Var5 = &p_Var4->_M_header;
      if (((_Rb_tree_header *)p_Var3 != p_Var4) &&
         (p_Var5 = p_Var3, pCVar1 < *(CDNode **)(p_Var3 + 1))) {
        p_Var5 = &p_Var4->_M_header;
      }
      if ((_Rb_tree_header *)p_Var5 != p_Var4) {
        local_60._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_60._M_impl.super__Rb_tree_header._M_header;
        local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
        p_Var2 = *(_Rb_tree_node_base **)(p_Var5 + 2);
        local_60._M_impl.super__Rb_tree_header._M_header._M_right =
             local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        if (p_Var2 != (_Rb_tree_node_base *)&p_Var5[1]._M_left) {
          do {
            local_68 = ICDGraphBuilder::getValue(&this->igraphBuilder,*(CDNode **)(p_Var2 + 1));
            std::
            _Rb_tree<llvm::Value*,llvm::Value*,std::_Identity<llvm::Value*>,std::less<llvm::Value*>,std::allocator<llvm::Value*>>
            ::_M_insert_unique<llvm::Value*>
                      ((_Rb_tree<llvm::Value*,llvm::Value*,std::_Identity<llvm::Value*>,std::less<llvm::Value*>,std::allocator<llvm::Value*>>
                        *)&local_60,&local_68);
            p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
          } while (p_Var2 != (_Rb_tree_node_base *)&p_Var5[1]._M_left);
        }
        (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<llvm::Value*,std::allocator<llvm::Value*>>::
        _M_range_initialize<std::_Rb_tree_const_iterator<llvm::Value*>>
                  ((vector<llvm::Value*,std::allocator<llvm::Value*>> *)__return_storage_ptr__,
                   local_60._M_impl.super__Rb_tree_header._M_header._M_left,
                   &local_60._M_impl.super__Rb_tree_header);
        std::
        _Rb_tree<llvm::Value_*,_llvm::Value_*,_std::_Identity<llvm::Value_*>,_std::less<llvm::Value_*>,_std::allocator<llvm::Value_*>_>
        ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent)
        ;
        return __return_storage_ptr__;
      }
    }
  }
  (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

ValVec getDependencies(const llvm::BasicBlock *b) override {
        if (getOptions().nodePerInstruction()) {
            return {};
        }

        _compute();

        auto *block = igraphBuilder.getNode(b);
        if (!block) {
            return {};
        }

        assert(_computed && "Did not compute CD");
        auto dit = controlDependence.find(block);
        if (dit == controlDependence.end())
            return {};

        std::set<llvm::Value *> ret;
        for (auto *dep : dit->second) {
            const auto *val = igraphBuilder.getValue(dep);
            assert(val && "Invalid value");
            ret.insert(const_cast<llvm::Value *>(val));
        }

        return ValVec{ret.begin(), ret.end()};
    }